

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

int Jf_ManComputeRefs(Jf_Man_t *p)

{
  Gia_Man_t *p_00;
  int iVar1;
  float *pfVar2;
  float *pfVar3;
  Gia_Obj_t *pObj_00;
  int *piVar4;
  bool bVar5;
  float *pFlow;
  float *pRefs;
  int *pCut;
  int i;
  float nRefsNew;
  Gia_Obj_t *pObj;
  Jf_Man_t *p_local;
  
  pfVar2 = Vec_FltArray(&p->vRefs);
  pfVar3 = Vec_FltArray(&p->vFlow);
  if (p->pGia->pRefs == (int *)0x0) {
    __assert_fail("p->pGia->pRefs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                  ,0x522,"int Jf_ManComputeRefs(Jf_Man_t *)");
  }
  piVar4 = p->pGia->pRefs;
  iVar1 = Gia_ManObjNum(p->pGia);
  memset(piVar4,0,(long)iVar1 << 2);
  p->pPars->Edge = 0;
  p->pPars->Area = 0;
  pCut._0_4_ = p->pGia->nObjs;
  while( true ) {
    pCut._0_4_ = (int)pCut + -1;
    bVar5 = false;
    if (-1 < (int)pCut) {
      _i = Gia_ManObj(p->pGia,(int)pCut);
      bVar5 = _i != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsCo(_i);
    if ((iVar1 == 0) && (iVar1 = Gia_ObjIsBuf(_i), iVar1 == 0)) {
      iVar1 = Gia_ObjIsAnd(_i);
      if ((iVar1 != 0) && (iVar1 = Gia_ObjRefNum(p->pGia,_i), 0 < iVar1)) {
        iVar1 = Jf_ObjIsUnit(_i);
        if (iVar1 == 0) {
          __assert_fail("Jf_ObjIsUnit(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                        ,0x52b,"int Jf_ManComputeRefs(Jf_Man_t *)");
        }
        piVar4 = Jf_ObjCutBest(p,(int)pCut);
        Jf_CutRef(p,piVar4);
        if (p->pPars->fGenCnf != 0) {
          iVar1 = Jf_CutCnfSize(p,piVar4);
          p->pPars->Clause = (long)iVar1 + p->pPars->Clause;
        }
        iVar1 = Jf_CutSize(piVar4);
        p->pPars->Edge = (long)iVar1 + p->pPars->Edge;
        p->pPars->Area = p->pPars->Area + 1;
      }
    }
    else {
      p_00 = p->pGia;
      pObj_00 = Gia_ObjFanin0(_i);
      Gia_ObjRefInc(p_00,pObj_00);
    }
  }
  pCut._0_4_ = 0;
  while( true ) {
    iVar1 = Gia_ManObjNum(p->pGia);
    if (iVar1 <= (int)pCut) {
      iVar1 = Jf_ManComputeDelay(p,1);
      p->pPars->Delay = (long)iVar1;
      return (int)p->pPars->Area;
    }
    if (p->pPars->fOptEdge == 0) {
      pCut._4_4_ = Abc_MaxFloat(1.0,pfVar2[(int)pCut] * 0.2 + (float)p->pGia->pRefs[(int)pCut] * 0.8
                               );
    }
    else {
      pCut._4_4_ = Abc_MaxFloat(1.0,pfVar2[(int)pCut] * 0.8 + (float)p->pGia->pRefs[(int)pCut] * 0.2
                               );
    }
    pfVar3[(int)pCut] = (pfVar3[(int)pCut] * pfVar2[(int)pCut]) / pCut._4_4_;
    pfVar2[(int)pCut] = pCut._4_4_;
    if (pfVar3[(int)pCut] < 0.0) break;
    pCut._0_4_ = (int)pCut + 1;
  }
  __assert_fail("pFlow[i] >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                ,0x53d,"int Jf_ManComputeRefs(Jf_Man_t *)");
}

Assistant:

int Jf_ManComputeRefs( Jf_Man_t * p )
{
    Gia_Obj_t * pObj; 
    float nRefsNew; int i, * pCut;
    float * pRefs = Vec_FltArray(&p->vRefs);
    float * pFlow = Vec_FltArray(&p->vFlow);
    assert( p->pGia->pRefs != NULL );
    memset( p->pGia->pRefs, 0, sizeof(int) * Gia_ManObjNum(p->pGia) );
    p->pPars->Area = p->pPars->Edge = 0;
    Gia_ManForEachObjReverse( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsCo(pObj) || Gia_ObjIsBuf(pObj) )
            Gia_ObjRefInc( p->pGia, Gia_ObjFanin0(pObj) );
        else if ( Gia_ObjIsAnd(pObj) && Gia_ObjRefNum(p->pGia, pObj) > 0 )
        {
            assert( Jf_ObjIsUnit(pObj) );
            pCut = Jf_ObjCutBest(p, i);
            Jf_CutRef( p, pCut );
            if ( p->pPars->fGenCnf )
            p->pPars->Clause += Jf_CutCnfSize(p, pCut);
            p->pPars->Edge += Jf_CutSize(pCut);
            p->pPars->Area++;
        }
    }
    // blend references and normalize flow
    for ( i = 0; i < Gia_ManObjNum(p->pGia); i++ )
    {
        if ( p->pPars->fOptEdge )
            nRefsNew = Abc_MaxFloat( 1, 0.8 * pRefs[i] + 0.2 * p->pGia->pRefs[i] );
        else
            nRefsNew = Abc_MaxFloat( 1, 0.2 * pRefs[i] + 0.8 * p->pGia->pRefs[i] );
        pFlow[i] = pFlow[i] * pRefs[i] / nRefsNew;
        pRefs[i] = nRefsNew;
        assert( pFlow[i] >= 0 );
    }
    // compute delay
    p->pPars->Delay = Jf_ManComputeDelay( p, 1 );
    return p->pPars->Area;
}